

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O2

void __thiscall
amrex::MFCellConsLinInterp::interp
          (MFCellConsLinInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *cgeom,Geometry *fgeom,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcomp)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pBVar8;
  FArrayBox *pFVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  int iVar14;
  double *pdVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int *piVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  uint uVar40;
  long lVar41;
  pointer pBVar42;
  ulong uVar43;
  int iVar44;
  long lVar45;
  int iVar46;
  uint uVar47;
  int iVar48;
  uint uVar49;
  long lVar50;
  long lVar51;
  ulong uVar52;
  uint uVar53;
  long lVar54;
  long lVar55;
  ulong uVar56;
  long lVar57;
  long lVar58;
  ulong uVar59;
  long lVar60;
  long lVar61;
  double *pdVar62;
  int iVar63;
  long lVar64;
  bool bVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  double dVar68;
  undefined1 auVar69 [16];
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  undefined1 auVar76 [16];
  double dVar77;
  long local_478;
  long local_460;
  int local_454;
  long local_450;
  double *local_448;
  long local_430;
  int local_428;
  long local_408;
  long local_400;
  long local_3f8;
  long local_3f0;
  long local_380;
  long local_378;
  long local_340;
  long local_338;
  Box result;
  Array4<const_double> local_240;
  FabArray<amrex::FArrayBox> *local_200;
  ulong local_1f8;
  ulong local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  Box lhs;
  Box result_1;
  FArrayBox tmpfab;
  Array4<double> local_f0;
  MFIter mfi;
  Box local_4c;
  
  pBVar8 = (bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_200 = &crsemf->super_FabArray<amrex::FArrayBox>;
  FArrayBox::FArrayBox(&tmpfab);
  uVar56 = 0;
  MFIter::MFIter(&mfi,(FabArrayBase *)finemf,'\0');
  if (0 < nc) {
    uVar56 = (ulong)(uint)nc;
  }
  local_1f8 = (ulong)(uint)(nc * 2);
  local_1f0 = (ulong)(uint)ccomp;
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      MFIter::~MFIter(&mfi);
      BaseFab<double>::~BaseFab(&tmpfab.super_BaseFab<double>);
      return;
    }
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_f0,&finemf->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_240,local_200,&mfi);
    piVar20 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar20 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + mfi.currentIndex;
    }
    pFVar9 = (local_200->m_fabs_v).
             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
             super__Vector_impl_data._M_start[*piVar20];
    uVar10 = *(undefined8 *)(pFVar9->super_BaseFab<double>).domain.smallend.vect;
    uVar11 = *(undefined8 *)((long)&(pFVar9->super_BaseFab<double>).domain.smallend + 8);
    uVar12 = *(undefined8 *)((long)&(pFVar9->super_BaseFab<double>).domain.bigend + 8);
    result.bigend.vect[1] =
         (int)((ulong)*(undefined8 *)(pFVar9->super_BaseFab<double>).domain.bigend.vect >> 0x20);
    result.bigend.vect[2] = (int)uVar12;
    result.btype.itype = (uint)((ulong)uVar12 >> 0x20);
    result.smallend.vect[2] = (int)uVar11;
    result.bigend.vect[0] = (int)((ulong)uVar11 >> 0x20);
    result.smallend.vect[0] = (int)uVar10;
    result.smallend.vect[1] = (int)((ulong)uVar10 >> 0x20);
    result.smallend.vect[2] = result.smallend.vect[2] + 1;
    result.bigend.vect[0] = result.bigend.vect[0] + -1;
    result.smallend.vect[1] = result.smallend.vect[1] + 1;
    result.smallend.vect[0] = result.smallend.vect[0] + 1;
    result.bigend.vect[1] = result.bigend.vect[1] + -1;
    result.bigend.vect[2] = result.bigend.vect[2] + -1;
    FArrayBox::resize(&tmpfab,&result,nc * 3,(Arena *)0x0);
    iVar18 = tmpfab.super_BaseFab<double>.domain.smallend.vect[2];
    iVar17 = tmpfab.super_BaseFab<double>.domain.smallend.vect[1];
    iVar16 = tmpfab.super_BaseFab<double>.domain.smallend.vect[0];
    pdVar15 = tmpfab.super_BaseFab<double>.dptr;
    lVar41 = (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[0];
    lVar36 = (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[1];
    lVar30 = (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[2];
    lVar57 = (long)((tmpfab.super_BaseFab<double>.domain.bigend.vect[0] -
                    tmpfab.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
    lVar32 = (long)((tmpfab.super_BaseFab<double>.domain.bigend.vect[1] -
                    tmpfab.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
    lVar33 = lVar32 * lVar57;
    lVar60 = (long)((tmpfab.super_BaseFab<double>.domain.bigend.vect[2] -
                    tmpfab.super_BaseFab<double>.domain.smallend.vect[2]) + 1);
    local_1e8 = lVar33 * lVar60;
    MFIter::validbox(&local_4c,&mfi);
    result_1.bigend.vect[1] = local_4c.bigend.vect[1];
    result_1.bigend.vect[2] = local_4c.bigend.vect[2];
    result_1.btype.itype = local_4c.btype.itype;
    result_1.smallend.vect[0] = local_4c.smallend.vect[0];
    result_1.smallend.vect[1] = local_4c.smallend.vect[1];
    result_1.smallend.vect[2] = local_4c.smallend.vect[2];
    result_1.bigend.vect[0] = local_4c.bigend.vect[0];
    Box::grow(&result_1,ng);
    lhs.smallend.vect[0] = result_1.smallend.vect[0];
    lhs.smallend.vect[1] = result_1.smallend.vect[1];
    lhs.smallend.vect[2] = result_1.smallend.vect[2];
    lhs.bigend.vect[0] = result_1.bigend.vect[0];
    lhs.bigend.vect[1] = result_1.bigend.vect[1];
    lhs.bigend.vect[2] = result_1.bigend.vect[2];
    lhs.btype.itype = result_1.btype.itype;
    Box::operator&=(&lhs,dest_domain);
    lVar50 = (long)result.smallend.vect[2];
    local_1e0 = (long)result.bigend.vect[2];
    if (this->do_linear_limiting == true) {
      lVar54 = (long)result.smallend.vect[1];
      lVar1 = lVar33 * 8;
      lVar22 = lVar57 * 8;
      local_338 = lVar50 + 2;
      local_340 = lVar50 + -2;
      iVar23 = result.smallend.vect[2] + -1;
      local_378 = (((long)(nc * 2) * 8 * lVar60 + lVar50 * 8 + lVar30 * -8) * lVar32 + lVar54 * 8 +
                  lVar36 * -8) * lVar57 + lVar41 * -8 + (long)pdVar15;
      local_380 = ((lVar60 * (long)nc * 8 + lVar50 * 8 + lVar30 * -8) * lVar32 + lVar54 * 8 +
                  lVar36 * -8) * lVar57 + lVar41 * -8 + (long)pdVar15;
      lVar32 = (lVar54 * 8 + (lVar50 - lVar30) * lVar32 * 8 + lVar36 * -8) * lVar57 + lVar41 * -8 +
               (long)pdVar15;
      local_454 = result.smallend.vect[2];
      while (local_454 = local_454 + 1, lVar50 <= local_1e0) {
        local_450 = local_380;
        local_430 = local_378;
        lVar36 = lVar54;
        local_460 = lVar32;
        iVar3 = result.smallend.vect[1] + -1;
        iVar2 = result.smallend.vect[1] + -2;
        iVar24 = result.smallend.vect[1] + 2;
        iVar14 = result.smallend.vect[1];
        while( true ) {
          iVar14 = iVar14 + 1;
          iVar39 = (int)lVar36;
          if (result.bigend.vect[1] < iVar39) break;
          if (result.smallend.vect[0] <= result.bigend.vect[0]) {
            iVar44 = result.smallend.vect[0] + -1;
            iVar46 = result.smallend.vect[0] + -2;
            iVar48 = result.smallend.vect[0] + 2;
            uVar59 = result.smallend.vect._0_8_;
            iVar35 = result.smallend.vect[0];
            do {
              iVar35 = iVar35 + 1;
              iVar13 = (int)uVar59;
              lVar58 = (long)local_240.begin.y;
              lVar61 = (long)local_240.begin.z;
              lVar45 = local_240.kstride * 8;
              lVar28 = (lVar50 - lVar61) * lVar45;
              lVar21 = local_240.jstride * 8;
              lVar37 = (lVar36 - lVar58) * lVar21;
              lVar34 = (long)local_240.begin.x;
              lVar38 = lVar37 + lVar28;
              lVar41 = (long)iVar13;
              local_3f0 = lVar38 + (long)iVar48 * 8 + lVar34 * -8 + (long)local_240.p;
              lVar64 = lVar38 + lVar41 * 8 + lVar34 * -8 + (long)local_240.p;
              local_3f8 = lVar38 + (long)iVar46 * 8 + lVar34 * -8 + (long)local_240.p;
              local_400 = (iVar24 - lVar58) * lVar21 + lVar28 + lVar41 * 8 + lVar34 * -8 +
                          (long)local_240.p;
              local_408 = (iVar2 - lVar58) * lVar21 + lVar28 + lVar41 * 8 + lVar34 * -8 +
                          (long)local_240.p;
              lVar58 = (local_338 - lVar61) * lVar45 + lVar37 + lVar41 * 8 + lVar34 * -8 +
                       (long)local_240.p;
              lVar29 = (local_340 - lVar61) * lVar45 + lVar37 + lVar41 * 8 + lVar34 * -8 +
                       (long)local_240.p;
              lVar55 = (iVar23 - local_240.begin.z) * lVar45 + lVar37 + lVar41 * 8 + lVar34 * -8 +
                       (long)local_240.p;
              lVar37 = (local_454 - local_240.begin.z) * lVar45 + lVar37 + lVar41 * 8 + lVar34 * -8
                       + (long)local_240.p;
              lVar51 = (iVar3 - local_240.begin.y) * lVar21 + lVar28 + lVar41 * 8 + lVar34 * -8 +
                       (long)local_240.p;
              lVar34 = (iVar14 - local_240.begin.y) * lVar21 + lVar28 + lVar41 * 8 + lVar34 * -8 +
                       (long)local_240.p;
              lVar45 = lVar38 + (long)(iVar44 - local_240.begin.x) * 8 + (long)local_240.p;
              local_478 = lVar38 + (long)(iVar35 - local_240.begin.x) * 8 + (long)local_240.p;
              lVar41 = lVar41 * 8;
              lVar38 = (long)ccomp * 8 * local_240.nstride;
              lVar28 = local_240.nstride * 8;
              dVar74 = 1.0;
              uVar66 = 0;
              uVar67 = 0x3ff00000;
              dVar73 = 1.0;
              iVar4 = (cgeom->domain).smallend.vect[0];
              iVar27 = (cgeom->domain).smallend.vect[1];
              iVar63 = (cgeom->domain).bigend.vect[0];
              iVar5 = (cgeom->domain).bigend.vect[1];
              iVar6 = (cgeom->domain).smallend.vect[2];
              iVar7 = (cgeom->domain).bigend.vect[2];
              lVar21 = lVar41;
              piVar20 = pBVar8[bcomp].bc + 5;
              uVar59 = uVar56;
              while (bVar65 = uVar59 != 0, uVar59 = uVar59 - 1, uVar26 = uVar56, bVar65) {
                dVar72 = *(double *)(local_478 + lVar38);
                dVar70 = *(double *)(lVar45 + lVar38);
                dVar68 = (dVar72 - dVar70) * 0.5;
                if ((iVar4 == iVar13) && (((BCRec *)(piVar20 + -5))->bc[0] - 3U < 2)) {
                  if (iVar13 + 2 < local_240.end.x) {
                    dVar68 = *(double *)(local_3f0 + lVar38) * -0.1 +
                             dVar72 * 0.6666666666666666 +
                             dVar70 * -1.0666666666666667 + *(double *)(lVar64 + lVar38) * 0.5;
                  }
                  else {
                    dVar68 = (dVar70 * -6.0 + *(double *)(lVar64 + lVar38) * 5.0 + dVar72) * 0.25;
                  }
                }
                if ((iVar63 == iVar13) && (piVar20[-2] - 3U < 2)) {
                  if (iVar13 + -2 < local_240.begin.x) {
                    dVar68 = (dVar72 * -6.0 + *(double *)(lVar64 + lVar38) * 5.0 + dVar70) * -0.25;
                  }
                  else {
                    dVar68 = *(double *)(local_3f8 + lVar38) * 0.1 +
                             dVar70 * -0.6666666666666666 +
                             dVar72 * 1.0666666666666667 + *(double *)(lVar64 + lVar38) * -0.5;
                  }
                }
                dVar70 = *(double *)(lVar64 + lVar38) - dVar70;
                dVar72 = dVar72 - *(double *)(lVar64 + lVar38);
                dVar70 = dVar70 + dVar70;
                dVar72 = dVar72 + dVar72;
                dVar71 = 0.0;
                if (0.0 <= dVar72 * dVar70) {
                  dVar71 = ABS(dVar70);
                  dVar72 = ABS(dVar72);
                  if (dVar72 <= dVar71) {
                    dVar71 = dVar72;
                  }
                }
                if ((dVar68 != 0.0) || (dVar72 = dVar73, NAN(dVar68))) {
                  dVar72 = ABS(dVar68);
                  if (dVar71 <= ABS(dVar68)) {
                    dVar72 = dVar71;
                  }
                  dVar72 = (dVar72 * (double)((ulong)dVar68 & 0x8000000000000000 |
                                             0x3ff0000000000000)) / dVar68;
                  if (dVar73 <= dVar72) {
                    dVar72 = dVar73;
                  }
                }
                dVar73 = dVar72;
                *(double *)(local_460 + lVar21) = dVar68;
                dVar72 = *(double *)(lVar34 + lVar38);
                dVar70 = *(double *)(lVar51 + lVar38);
                dVar68 = (dVar72 - dVar70) * 0.5;
                if ((iVar27 == iVar39) && (piVar20[-4] - 3U < 2)) {
                  if (iVar39 + 2 < local_240.end.y) {
                    dVar68 = *(double *)(local_400 + lVar38) * -0.1 +
                             dVar72 * 0.6666666666666666 +
                             dVar70 * -1.0666666666666667 + *(double *)(lVar64 + lVar38) * 0.5;
                  }
                  else {
                    dVar68 = (dVar70 * -6.0 + *(double *)(lVar64 + lVar38) * 5.0 + dVar72) * 0.25;
                  }
                }
                if (iVar5 == iVar39) {
                  dVar71 = *(double *)(lVar64 + lVar38);
                  if (piVar20[-1] - 3U < 2) {
                    if (iVar39 + -2 < local_240.begin.y) {
                      dVar68 = (dVar72 * -6.0 + dVar71 * 5.0 + dVar70) * -0.25;
                    }
                    else {
                      dVar68 = *(double *)(local_408 + lVar38) * 0.1 +
                               dVar70 * -0.6666666666666666 +
                               dVar72 * 1.0666666666666667 + dVar71 * -0.5;
                    }
                  }
                }
                else {
                  dVar71 = *(double *)(lVar64 + lVar38);
                }
                dVar70 = (dVar71 - dVar70) + (dVar71 - dVar70);
                dVar71 = (dVar72 - dVar71) + (dVar72 - dVar71);
                dVar72 = 0.0;
                if (0.0 <= dVar71 * dVar70) {
                  dVar72 = ABS(dVar70);
                  dVar71 = ABS(dVar71);
                  if (dVar71 <= dVar72) {
                    dVar72 = dVar71;
                  }
                }
                if ((dVar68 != 0.0) || (NAN(dVar68))) {
                  dVar70 = ABS(dVar68);
                  if (dVar72 <= ABS(dVar68)) {
                    dVar70 = dVar72;
                  }
                  dVar72 = (dVar70 * (double)((ulong)dVar68 & 0x8000000000000000 |
                                             0x3ff0000000000000)) / dVar68;
                  if ((double)CONCAT44(uVar67,uVar66) <= dVar72) {
                    dVar72 = (double)CONCAT44(uVar67,uVar66);
                  }
                  uVar66 = SUB84(dVar72,0);
                  uVar67 = (undefined4)((ulong)dVar72 >> 0x20);
                }
                *(double *)(local_450 + lVar21) = dVar68;
                dVar72 = *(double *)(lVar37 + lVar38);
                dVar70 = *(double *)(lVar55 + lVar38);
                dVar68 = (dVar72 - dVar70) * 0.5;
                local_428 = (int)lVar50;
                if ((iVar6 == local_428) && (piVar20[-3] - 3U < 2)) {
                  if (lVar50 + 2 < (long)local_240.end.z) {
                    dVar68 = *(double *)(lVar58 + lVar38) * -0.1 +
                             dVar72 * 0.6666666666666666 +
                             dVar70 * -1.0666666666666667 + *(double *)(lVar64 + lVar38) * 0.5;
                  }
                  else {
                    dVar68 = (dVar70 * -6.0 + *(double *)(lVar64 + lVar38) * 5.0 + dVar72) * 0.25;
                  }
                }
                if (iVar7 == local_428) {
                  dVar71 = *(double *)(lVar64 + lVar38);
                  if (*piVar20 - 3U < 2) {
                    if (lVar50 + -2 < lVar61) {
                      dVar68 = (dVar72 * -6.0 + dVar71 * 5.0 + dVar70) * -0.25;
                    }
                    else {
                      dVar68 = *(double *)(lVar29 + lVar38) * 0.1 +
                               dVar70 * -0.6666666666666666 +
                               dVar72 * 1.0666666666666667 + dVar71 * -0.5;
                    }
                  }
                }
                else {
                  dVar71 = *(double *)(lVar64 + lVar38);
                }
                dVar70 = (dVar71 - dVar70) + (dVar71 - dVar70);
                dVar71 = (dVar72 - dVar71) + (dVar72 - dVar71);
                dVar72 = 0.0;
                if (0.0 <= dVar71 * dVar70) {
                  dVar72 = ABS(dVar70);
                  dVar71 = ABS(dVar71);
                  if (dVar71 <= dVar72) {
                    dVar72 = dVar71;
                  }
                }
                if ((dVar68 != 0.0) || (dVar70 = dVar74, NAN(dVar68))) {
                  dVar70 = ABS(dVar68);
                  if (dVar72 <= ABS(dVar68)) {
                    dVar70 = dVar72;
                  }
                  dVar70 = (dVar70 * (double)((ulong)dVar68 & 0x8000000000000000 |
                                             0x3ff0000000000000)) / dVar68;
                  if (dVar74 <= dVar70) {
                    dVar70 = dVar74;
                  }
                }
                dVar74 = dVar70;
                *(double *)(local_430 + lVar21) = dVar68;
                lVar21 = lVar21 + lVar1 * lVar60;
                piVar20 = piVar20 + 6;
                local_3f0 = local_3f0 + lVar28;
                lVar64 = lVar64 + lVar28;
                local_3f8 = local_3f8 + lVar28;
                local_400 = local_400 + lVar28;
                local_408 = local_408 + lVar28;
                lVar58 = lVar58 + lVar28;
                lVar29 = lVar29 + lVar28;
                lVar55 = lVar55 + lVar28;
                lVar37 = lVar37 + lVar28;
                lVar51 = lVar51 + lVar28;
                lVar34 = lVar34 + lVar28;
                lVar45 = lVar45 + lVar28;
                local_478 = local_478 + lVar28;
              }
              while (uVar26 != 0) {
                *(double *)(local_460 + lVar41) = *(double *)(local_460 + lVar41) * dVar73;
                *(double *)(local_450 + lVar41) =
                     *(double *)(local_450 + lVar41) * (double)CONCAT44(uVar67,uVar66);
                *(double *)(local_430 + lVar41) = *(double *)(local_430 + lVar41) * dVar74;
                lVar41 = lVar41 + lVar1 * lVar60;
                uVar26 = uVar26 - 1;
              }
              iVar48 = iVar48 + 1;
              iVar46 = iVar46 + 1;
              iVar44 = iVar44 + 1;
              uVar59 = (ulong)(iVar13 + 1);
            } while (iVar13 != result.bigend.vect[0]);
          }
          lVar36 = lVar36 + 1;
          local_430 = local_430 + lVar22;
          local_450 = local_450 + lVar22;
          local_460 = local_460 + lVar22;
          iVar24 = iVar24 + 1;
          iVar2 = iVar2 + 1;
          iVar3 = iVar3 + 1;
        }
        local_338 = local_338 + 1;
        local_340 = local_340 + 1;
        iVar23 = iVar23 + 1;
        local_378 = local_378 + lVar1;
        local_380 = local_380 + lVar1;
        lVar32 = lVar32 + lVar1;
        lVar50 = lVar50 + 1;
      }
    }
    else {
      for (uVar59 = 0; uVar59 != uVar56; uVar59 = uVar59 + 1) {
        iVar23 = (int)uVar59;
        pBVar42 = pBVar8 + (long)bcomp + uVar59;
        lVar32 = lVar50;
        while (lVar32 <= local_1e0) {
          lVar36 = lVar32 + 1;
          lVar60 = lVar32 + 2;
          lVar1 = lVar32 + -2;
          lVar37 = (long)local_240.begin.x;
          lVar28 = (long)local_240.begin.z;
          iVar35 = (int)lVar32;
          lVar29 = (iVar35 - local_240.begin.z) * local_240.kstride;
          lVar58 = local_240.nstride * ((int)local_1f0 + iVar23);
          lVar22 = (lVar32 - lVar30) * lVar33;
          lVar54 = (long)(cgeom->domain).smallend.vect[0];
          lVar21 = (long)(cgeom->domain).bigend.vect[0];
          iVar24 = (cgeom->domain).smallend.vect[1];
          iVar2 = (cgeom->domain).smallend.vect[2];
          iVar3 = (cgeom->domain).bigend.vect[1];
          iVar14 = (cgeom->domain).bigend.vect[2];
          iVar39 = result.smallend.vect[1];
          while (iVar44 = iVar39, lVar32 = lVar36, iVar44 <= result.bigend.vect[1]) {
            if (result.bigend.vect[0] < result.smallend.vect[0]) {
              iVar39 = iVar44 + 1;
            }
            else {
              lVar34 = (iVar44 - local_240.begin.y) * local_240.jstride;
              lVar38 = (iVar44 - iVar17) * lVar57;
              iVar46 = ratio->vect[1];
              iVar48 = ratio->vect[2];
              iVar4 = ratio->vect[0];
              auVar69._0_8_ = (double)(iVar4 * 2);
              auVar69._8_8_ = (double)(iVar48 * 2);
              lVar32 = (long)result.smallend.vect[0];
              iVar27 = (result.smallend.vect[0] + -1) - local_240.begin.x;
              do {
                iVar63 = (int)(lVar32 + 1);
                dVar74 = local_240.p[lVar34 + lVar29 + lVar58 + (iVar63 - local_240.begin.x)];
                dVar73 = local_240.p[lVar34 + lVar29 + lVar58 + (~local_240.begin.x + (int)lVar32)];
                dVar72 = (dVar74 - dVar73) * 0.5;
                if ((lVar32 == lVar54) && (pBVar42->bc[0] - 3U < 2)) {
                  if (lVar54 + 2 < (long)local_240.end.x) {
                    dVar72 = local_240.p[lVar34 + lVar29 + lVar58 + ((lVar54 + 2) - lVar37)] * -0.1
                             + dVar74 * 0.6666666666666666 +
                               dVar73 * -1.0666666666666667 +
                               local_240.p[lVar34 + lVar29 + lVar58 + (lVar54 - lVar37)] * 0.5;
                  }
                  else {
                    dVar72 = (dVar73 * -6.0 +
                             local_240.p[lVar34 + lVar29 + lVar58 + (lVar54 - lVar37)] * 5.0 +
                             dVar74) * 0.25;
                  }
                }
                if ((lVar32 == lVar21) && (pBVar42->bc[3] - 3U < 2)) {
                  if (lVar21 + -2 < lVar37) {
                    dVar72 = (dVar74 * -6.0 +
                             local_240.p[lVar34 + lVar29 + lVar58 + (lVar21 - lVar37)] * 5.0 +
                             dVar73) * -0.25;
                  }
                  else {
                    dVar72 = local_240.p[lVar34 + lVar29 + lVar58 + ((lVar21 + -2) - lVar37)] * 0.1
                             + dVar73 * -0.6666666666666666 +
                               dVar74 * 1.0666666666666667 +
                               local_240.p[lVar34 + lVar29 + lVar58 + (lVar21 - lVar37)] * -0.5;
                  }
                }
                lVar45 = (long)((int)lVar32 - local_240.begin.x);
                dVar70 = local_240.p[lVar34 + lVar45 + lVar29 + lVar58];
                dVar73 = (dVar70 - dVar73) + (dVar70 - dVar73);
                dVar68 = (dVar74 - dVar70) + (dVar74 - dVar70);
                dVar74 = 0.0;
                if (0.0 <= dVar68 * dVar73) {
                  dVar74 = ABS(dVar73);
                  dVar68 = ABS(dVar68);
                  if (dVar68 <= dVar74) {
                    dVar74 = dVar68;
                  }
                }
                dVar73 = local_240.p
                         [lVar58 + lVar29 + ((iVar44 + 1) - local_240.begin.y) * local_240.jstride +
                                            lVar45];
                dVar68 = local_240.p
                         [lVar58 + lVar29 + (~local_240.begin.y + iVar44) * local_240.jstride +
                                            lVar45];
                dVar71 = (dVar73 - dVar68) * 0.5;
                if ((iVar24 == iVar44) && (pBVar42->bc[1] - 3U < 2)) {
                  if (iVar44 + 2 < local_240.end.y) {
                    dVar71 = local_240.p
                             [lVar58 + lVar29 + ((iVar44 + 2) - local_240.begin.y) *
                                                local_240.jstride + lVar45] * -0.1 +
                             dVar73 * 0.6666666666666666 +
                             dVar68 * -1.0666666666666667 + dVar70 * 0.5;
                  }
                  else {
                    dVar71 = (dVar68 * -6.0 + dVar70 * 5.0 + dVar73) * 0.25;
                  }
                }
                if ((iVar3 == iVar44) && (pBVar42->bc[4] - 3U < 2)) {
                  if (iVar44 + -2 < local_240.begin.y) {
                    dVar71 = (dVar73 * -6.0 + dVar70 * 5.0 + dVar68) * -0.25;
                  }
                  else {
                    dVar71 = local_240.p
                             [lVar58 + lVar29 + ((iVar44 + -2) - local_240.begin.y) *
                                                local_240.jstride + lVar45] * 0.1 +
                             dVar68 * -0.6666666666666666 +
                             dVar73 * 1.0666666666666667 + dVar70 * -0.5;
                  }
                }
                dVar68 = (dVar70 - dVar68) + (dVar70 - dVar68);
                dVar77 = (dVar73 - dVar70) + (dVar73 - dVar70);
                dVar73 = 0.0;
                if (0.0 <= dVar77 * dVar68) {
                  dVar73 = ABS(dVar68);
                  dVar77 = ABS(dVar77);
                  if (dVar77 <= dVar73) {
                    dVar73 = dVar77;
                  }
                }
                dVar68 = local_240.p
                         [lVar34 + lVar45 + ((int)lVar36 - local_240.begin.z) * local_240.kstride +
                                            lVar58];
                dVar77 = local_240.p
                         [lVar34 + lVar45 + (~local_240.begin.z + iVar35) * local_240.kstride +
                                            lVar58];
                dVar75 = (dVar68 - dVar77) * 0.5;
                if ((iVar2 == iVar35) && (pBVar42->bc[2] - 3U < 2)) {
                  if (lVar60 < local_240.end.z) {
                    dVar75 = local_240.p
                             [lVar34 + lVar45 + (lVar60 - lVar28) * local_240.kstride + lVar58] *
                             -0.1 + dVar68 * 0.6666666666666666 +
                                    dVar77 * -1.0666666666666667 + dVar70 * 0.5;
                  }
                  else {
                    dVar75 = (dVar77 * -6.0 + dVar70 * 5.0 + dVar68) * 0.25;
                  }
                }
                if ((iVar14 == iVar35) && (pBVar42->bc[5] - 3U < 2)) {
                  if (lVar1 < lVar28) {
                    dVar75 = (dVar68 * -6.0 + dVar70 * 5.0 + dVar77) * -0.25;
                  }
                  else {
                    dVar75 = local_240.p
                             [lVar34 + lVar45 + (lVar1 - lVar28) * local_240.kstride + lVar58] * 0.1
                             + dVar77 * -0.6666666666666666 +
                               dVar68 * 1.0666666666666667 + dVar70 * -0.5;
                  }
                }
                dVar77 = (dVar70 - dVar77) + (dVar70 - dVar77);
                dVar68 = (dVar68 - dVar70) + (dVar68 - dVar70);
                uVar66 = 0;
                uVar67 = 0;
                if (0.0 <= dVar68 * dVar77) {
                  dVar77 = ABS(dVar77);
                  dVar68 = ABS(dVar68);
                  if (dVar68 <= dVar77) {
                    dVar77 = dVar68;
                  }
                  uVar66 = SUB84(dVar77,0);
                  uVar67 = (undefined4)((ulong)dVar77 >> 0x20);
                }
                dVar68 = ABS(dVar72);
                if (dVar74 <= ABS(dVar72)) {
                  dVar68 = dVar74;
                }
                dVar68 = dVar68 * (double)((ulong)dVar72 & 0x8000000000000000 | 0x3ff0000000000000);
                dVar74 = ABS(dVar71);
                if (dVar73 <= ABS(dVar71)) {
                  dVar74 = dVar73;
                }
                dVar74 = dVar74 * (double)((ulong)dVar71 & 0x8000000000000000 | 0x3ff0000000000000);
                dVar73 = ABS(dVar75);
                if ((double)CONCAT44(uVar67,uVar66) <= dVar73) {
                  dVar73 = (double)CONCAT44(uVar67,uVar66);
                }
                dVar73 = dVar73 * (double)((ulong)dVar75 & 0x8000000000000000 | 0x3ff0000000000000);
                if ((((dVar68 != 0.0) || (NAN(dVar68))) || (dVar74 != 0.0)) || (NAN(dVar74))) {
LAB_00457bc4:
                  dVar71 = dVar70;
                  dVar72 = dVar70;
                  for (lVar45 = -1; lVar45 != 2; lVar45 = lVar45 + 1) {
                    for (lVar51 = -1; lVar51 != 2; lVar51 = lVar51 + 1) {
                      for (lVar55 = 0; lVar55 != 3; lVar55 = lVar55 + 1) {
                        dVar77 = local_240.p
                                 [lVar58 + ((iVar35 - local_240.begin.z) + (int)lVar45) *
                                           local_240.kstride +
                                           ((int)lVar51 + (iVar44 - local_240.begin.y)) *
                                           local_240.jstride + (long)(iVar27 + (int)lVar55)];
                        dVar75 = dVar77;
                        if (dVar71 <= dVar77) {
                          dVar75 = dVar71;
                        }
                        dVar71 = dVar75;
                        if (dVar77 <= dVar72) {
                          dVar77 = dVar72;
                        }
                        dVar72 = dVar77;
                      }
                    }
                  }
                  auVar76._0_8_ = ABS(dVar68) * (double)(iVar4 + -1);
                  auVar76._8_8_ = ABS(dVar73) * (double)(iVar48 + -1);
                  auVar76 = divpd(auVar76,auVar69);
                  dVar77 = auVar76._8_8_ +
                           (ABS(dVar74) * (double)(iVar46 + -1)) / (double)(iVar46 * 2) +
                           auVar76._0_8_;
                  uVar26 = -(ulong)(dVar72 - dVar70 < dVar77);
                  dVar72 = (double)(~uVar26 & 0x3ff0000000000000 |
                                   (ulong)((dVar72 - dVar70) / dVar77) & uVar26);
                  if (dVar70 - dVar71 < dVar77 * dVar72) {
                    dVar72 = (dVar70 - dVar71) / dVar77;
                  }
                }
                else {
                  dVar72 = 1.0;
                  if ((dVar73 != 0.0) || (NAN(dVar73))) goto LAB_00457bc4;
                }
                lVar45 = lVar32 - lVar41;
                pdVar15[lVar22 + lVar38 + lVar45 + uVar59 * local_1e8] = dVar68 * dVar72;
                pdVar15[lVar22 + lVar38 + lVar45 + (iVar23 + nc) * local_1e8] = dVar74 * dVar72;
                pdVar15[lVar22 + lVar38 + lVar45 + ((int)local_1f8 + iVar23) * local_1e8] =
                     dVar73 * dVar72;
                iVar27 = iVar27 + 1;
                lVar32 = lVar32 + 1;
                iVar39 = iVar44 + 1;
              } while (result.bigend.vect[0] + 1 != iVar63);
            }
          }
        }
      }
    }
    iVar23 = fcomp;
    for (uVar59 = 0; uVar59 != uVar56; uVar59 = uVar59 + 1) {
      iVar24 = (int)uVar59;
      for (uVar26 = (long)lhs.smallend.vect[2]; uVar25 = (uint)uVar26,
          (int)uVar25 <= lhs.bigend.vect[2]; uVar26 = uVar26 + 1) {
        iVar2 = ratio->vect[0];
        iVar3 = ratio->vect[1];
        iVar14 = ratio->vect[2];
        local_448 = (double *)
                    ((long)local_f0.p +
                    local_f0.nstride * (long)iVar23 * 8 +
                    ((long)lhs.smallend.vect[1] - (long)local_f0.begin.y) * local_f0.jstride * 8 +
                    (uVar26 - (long)local_f0.begin.z) * local_f0.kstride * 8 +
                    (long)local_f0.begin.x * -8 + (long)lhs.smallend.vect[0] * 8);
        for (uVar43 = (long)lhs.smallend.vect[1]; (long)uVar43 <= (long)lhs.bigend.vect[1];
            uVar43 = uVar43 + 1) {
          if (lhs.smallend.vect[0] <= lhs.bigend.vect[0]) {
            uVar40 = (uint)uVar43;
            uVar52 = (long)lhs.smallend.vect[0];
            pdVar62 = local_448;
            uVar47 = ~lhs.smallend.vect[0];
            do {
              uVar49 = (uint)uVar52;
              if (iVar2 == 4) {
                if ((long)uVar52 < 0) {
                  uVar53 = (int)uVar49 >> 2;
                }
                else {
                  uVar53 = uVar49 >> 2;
                }
              }
              else if (iVar2 == 2) {
                if ((long)uVar52 < 0) {
                  uVar53 = (int)uVar49 >> 1;
                }
                else {
                  uVar53 = uVar49 >> 1;
                }
              }
              else {
                uVar53 = uVar49;
                if (iVar2 != 1) {
                  if ((long)uVar52 < 0) {
                    uVar53 = ~((int)uVar47 / iVar2);
                  }
                  else {
                    uVar53 = (uint)((long)((ulong)(uint)((int)uVar49 >> 0x1f) << 0x20 |
                                          uVar52 & 0xffffffff) / (long)iVar2);
                  }
                }
              }
              uVar31 = uVar40;
              if (((iVar3 != 1) && (uVar31 = (int)uVar40 >> 2, iVar3 != 4)) &&
                 (uVar31 = (int)uVar40 >> 1, iVar3 != 2)) {
                if ((long)uVar43 < 0) {
                  uVar31 = ~((int)~uVar40 / iVar3);
                }
                else {
                  uVar31 = (uint)((long)((ulong)(uint)((int)uVar40 >> 0x1f) << 0x20 |
                                        uVar43 & 0xffffffff) / (long)iVar3);
                }
              }
              uVar19 = uVar25;
              if (((iVar14 != 1) && (uVar19 = (int)uVar25 >> 2, iVar14 != 4)) &&
                 (uVar19 = (int)uVar25 >> 1, iVar14 != 2)) {
                if ((int)uVar25 < 0) {
                  uVar19 = ~((int)~uVar25 / iVar14);
                }
                else {
                  uVar19 = (uint)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 |
                                        uVar26 & 0xffffffff) / (long)iVar14);
                }
              }
              lVar50 = (long)(int)(uVar53 - iVar16);
              lVar36 = (int)(uVar31 - iVar17) * lVar57;
              lVar32 = (int)(uVar19 - iVar18) * lVar33;
              *pdVar62 = (((double)(int)(uVar25 - uVar19 * iVar14) + 0.5) / (double)iVar14 + -0.5) *
                         pdVar15[lVar36 + lVar50 + lVar32 + ((int)local_1f8 + iVar24) * local_1e8] +
                         (((double)(int)(uVar40 - uVar31 * iVar3) + 0.5) / (double)iVar3 + -0.5) *
                         pdVar15[lVar36 + lVar50 + lVar32 + (iVar24 + nc) * local_1e8] +
                         (((double)(int)(-iVar2 * uVar53 + uVar49) + 0.5) / (double)iVar2 + -0.5) *
                         pdVar15[lVar36 + lVar50 + lVar32 + uVar59 * local_1e8] +
                         local_240.p
                         [((long)(int)uVar31 - (long)local_240.begin.y) * local_240.jstride +
                          ((long)(int)uVar53 - (long)local_240.begin.x) +
                          ((long)(int)uVar19 - (long)local_240.begin.z) * local_240.kstride +
                          local_240.nstride * ((int)local_1f0 + iVar24)];
              uVar52 = uVar52 + 1;
              pdVar62 = pdVar62 + 1;
              uVar47 = uVar47 - 1;
            } while (lhs.bigend.vect[0] + 1 != (int)uVar52);
          }
          local_448 = local_448 + local_f0.jstride;
        }
      }
      iVar23 = iVar23 + 1;
    }
    local_1d8 = lVar33;
    local_1d0 = lVar30;
    MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void
MFCellConsLinInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                             IntVect const& ng, Geometry const& cgeom, Geometry const& fgeom,
                             Box const& dest_domain, IntVect const& ratio,
                             Vector<BCRec> const& bcs, int bcomp)
{
    AMREX_ASSERT(crsemf.nGrowVect() == 0);
    amrex::ignore_unused(fgeom);

    Box const& cdomain = cgeom.Domain();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        MultiFab crse_tmp(crsemf.boxArray(), crsemf.DistributionMap(), AMREX_SPACEDIM*nc, 0);
        auto const& crse = crsemf.const_arrays();
        auto const& tmp = crse_tmp.arrays();
        auto const& ctmp = crse_tmp.const_arrays();
        auto const& fine = finemf.arrays();

        Gpu::DeviceVector<BCRec> d_bc(nc);
        BCRec const* pbc = d_bc.data();
        Gpu::copyAsync(Gpu::hostToDevice, bcs.begin()+bcomp, bcs.begin()+bcomp+nc, d_bc.begin());

#if (AMREX_SPACEDIM == 1)
        if (cgeom.IsSPHERICAL()) {
            Real drf = fgeom.CellSize(0);
            Real rlo = fgeom.Offset(0);
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int, int) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,0,0, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int, int, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp[box_no], crse[box_no], ccomp, nc,
                                                        cdomain, ratio, pbc, drf, rlo);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int, int, int n) noexcept
            {
                if (dest_domain.contains(i,0,0)) {
                    mf_cell_cons_lin_interp_sph(i, n, fine[box_no], fcomp, ctmp[box_no],
                                                crse[box_no], ccomp, nc, ratio, drf, rlo);
                }
            });
        } else
#elif (AMREX_SPACEDIM == 2)
        if (cgeom.IsRZ()) {
            Real drf = fgeom.CellSize(0);
            Real rlo = fgeom.Offset(0);
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,j,0, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope_rz(i,j,n, tmp[box_no], crse[box_no], ccomp, nc,
                                                       cdomain, ratio, pbc, drf, rlo);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int, int n) noexcept
            {
                if (dest_domain.contains(i,j,0)) {
                    mf_cell_cons_lin_interp_rz(i, j, n, fine[box_no], fcomp, ctmp[box_no],
                                               crse[box_no], ccomp, nc, ratio, drf, rlo);
                }
            });
        } else
#endif
        {
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,j,k, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, ratio, pbc);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                if (dest_domain.contains(i,j,k)) {
                    mf_cell_cons_lin_interp(i,j,k,n, fine[box_no], fcomp, ctmp[box_no],
                                            crse[box_no], ccomp, nc, ratio);
                }
            });
        }

        Gpu::streamSynchronize();
    } else
#endif
    {
        BCRec const* pbc = bcs.data() + bcomp;

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        {
            FArrayBox tmpfab;
            for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
                auto const& fine = finemf.array(mfi);
                auto const& crse = crsemf.const_array(mfi);

                Box const& cbox = amrex::grow(crsemf[mfi].box(), -1);
                tmpfab.resize(cbox, AMREX_SPACEDIM*nc);
                auto const& tmp = tmpfab.array();
                auto const& ctmp = tmpfab.const_array();

                Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;

#if (AMREX_SPACEDIM == 1)
                if (cgeom.IsSPHERICAL()) {
                    Real drf = fgeom.CellSize(0);
                    Real rlo = fgeom.Offset(0);
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int, int) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,0,0, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int, int, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp, crse, ccomp, nc,
                                                                cdomain, ratio, pbc, drf, rlo);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int, int, int n) noexcept
                    {
                        mf_cell_cons_lin_interp_sph(i, n, fine, fcomp, ctmp,
                                                    crse, ccomp, nc, ratio, drf, rlo);
                    });
                } else
#elif (AMREX_SPACEDIM == 2)
                if (cgeom.IsRZ()) {
                    Real drf = fgeom.CellSize(0);
                    Real rlo = fgeom.Offset(0);
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int j, int) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,j,0, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int j, int, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope_rz(i, j, n, tmp, crse, ccomp, nc,
                                                               cdomain, ratio, pbc, drf, rlo);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int j, int, int n) noexcept
                    {
                        mf_cell_cons_lin_interp_rz(i, j, n, fine, fcomp, ctmp,
                                                   crse, ccomp, nc, ratio, drf, rlo);
                    });
                } else
#endif
                {
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int j, int k) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int j, int k, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp, crse, ccomp, nc,
                                                            cdomain, ratio, pbc);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int j, int k, int n) noexcept
                    {
                        mf_cell_cons_lin_interp(i,j,k,n, fine, fcomp, ctmp,
                                                crse, ccomp, nc, ratio);
                    });
                }
            }
        }
    }
}